

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

void Bus_SclCheckSortedFanout(Vec_Ptr_t *vFanouts)

{
  int iVar1;
  uint local_24;
  Abc_Obj_t *pAStack_20;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vFanouts_local;
  
  local_24 = 0;
  pObj = (Abc_Obj_t *)vFanouts;
  while( true ) {
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj);
    if (iVar1 + -1 <= (int)local_24) {
      return;
    }
    pNext = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_24);
    pAStack_20 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_24 + 1);
    iVar1 = Bus_SclCompareFanouts(&pNext,&stack0xffffffffffffffe0);
    if (iVar1 != -1) break;
    local_24 = local_24 + 1;
  }
  printf("Fanouts %d and %d are out of order.\n",(ulong)local_24,(ulong)(local_24 + 1));
  Abc_NtkPrintFanoutProfileVec((Abc_Obj_t *)0x0,(Vec_Ptr_t *)pObj);
  return;
}

Assistant:

void Bus_SclCheckSortedFanout( Vec_Ptr_t * vFanouts )
{
    Abc_Obj_t * pObj, * pNext;
    int i;
    for ( i = 0; i < Vec_PtrSize(vFanouts) - 1; i++ )
    {
        pObj  = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i);
        pNext = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i+1);
        if ( Bus_SclCompareFanouts( &pObj, &pNext ) != -1 )
        {
            printf( "Fanouts %d and %d are out of order.\n", i, i+1 );
            Abc_NtkPrintFanoutProfileVec( NULL, vFanouts );
            return;
        }
    }
}